

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O2

void read_delta_q_params(AV1_COMMON *cm,MACROBLOCKD *xd,aom_reader *r)

{
  uint8_t uVar1;
  char cVar2;
  MB_MODE_INFO *mbmi;
  int8_t iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  aom_cdf_prob (*cdf) [5];
  long lVar7;
  bool bVar8;
  
  if ((cm->delta_q_info).delta_q_present_flag == 0) {
    return;
  }
  mbmi = *xd->mi;
  bVar8 = (cm->seq_params->mib_size - 1U & (xd->mi_row | xd->mi_col)) == 0;
  if (mbmi->bsize == cm->seq_params->sb_size) {
    if (mbmi->skip_txfm == '\0' && bVar8) {
LAB_0016b552:
      iVar6 = aom_read_symbol_(r,xd->tile_ctx->delta_q_cdf,4);
      if (2 < iVar6) {
        iVar6 = aom_read_literal_(r,3);
        iVar5 = aom_read_literal_(r,iVar6 + 1);
        iVar6 = iVar5 + (1 << ((byte)(iVar6 + 1) & 0x1f)) + 1;
      }
      if (iVar6 == 0) {
        iVar5 = 0;
      }
      else {
        iVar4 = aom_read_bit_(r);
        iVar5 = -iVar6;
        if (iVar4 == 0) {
          iVar5 = iVar6;
        }
      }
      goto LAB_0016b5bd;
    }
  }
  else if (bVar8) goto LAB_0016b552;
  iVar5 = 0;
LAB_0016b5bd:
  iVar6 = iVar5 * (cm->delta_q_info).delta_q_res + xd->current_base_qindex;
  if (0xfe < iVar6) {
    iVar6 = 0xff;
  }
  iVar5 = 1;
  if (1 < iVar6) {
    iVar5 = iVar6;
  }
  xd->current_base_qindex = iVar5;
  if ((cm->delta_q_info).delta_lf_present_flag != 0) {
    iVar6 = xd->mi_row;
    iVar5 = xd->mi_col;
    if ((cm->delta_q_info).delta_lf_multi == 0) {
      cVar2 = xd->delta_lf_from_base;
      iVar6 = read_delta_lflevel(cm,r,xd->tile_ctx->delta_lf_cdf,mbmi,iVar5,iVar6);
      iVar5 = iVar6 * (cm->delta_q_info).delta_lf_res + (int)cVar2;
      iVar6 = 0x3f;
      if (iVar5 < 0x3f) {
        iVar6 = iVar5;
      }
      iVar3 = -0x3f;
      if (-0x3f < iVar6) {
        iVar3 = (int8_t)iVar6;
      }
      xd->delta_lf_from_base = iVar3;
      mbmi->delta_lf_from_base = iVar3;
    }
    else {
      uVar1 = cm->seq_params->monochrome;
      cdf = xd->tile_ctx->delta_lf_multi_cdf;
      for (lVar7 = 0; (ulong)(uVar1 == '\0') * 2 + 2 != lVar7; lVar7 = lVar7 + 1) {
        cVar2 = xd->delta_lf[lVar7];
        iVar4 = read_delta_lflevel(cm,r,*cdf,mbmi,iVar5,iVar6);
        iVar4 = iVar4 * (cm->delta_q_info).delta_lf_res + (int)cVar2;
        if (0x3e < iVar4) {
          iVar4 = 0x3f;
        }
        if (iVar4 < -0x3e) {
          iVar4 = -0x3f;
        }
        xd->delta_lf[lVar7] = (int8_t)iVar4;
        mbmi->delta_lf[lVar7] = (int8_t)iVar4;
        cdf = cdf + 1;
      }
    }
  }
  return;
}

Assistant:

static void read_delta_q_params(AV1_COMMON *const cm, MACROBLOCKD *const xd,
                                aom_reader *r) {
  DeltaQInfo *const delta_q_info = &cm->delta_q_info;

  if (delta_q_info->delta_q_present_flag) {
    MB_MODE_INFO *const mbmi = xd->mi[0];
    xd->current_base_qindex +=
        read_delta_qindex(cm, xd, r, mbmi) * delta_q_info->delta_q_res;
    /* Normative: Clamp to [1,MAXQ] to not interfere with lossless mode */
    xd->current_base_qindex = clamp(xd->current_base_qindex, 1, MAXQ);
    FRAME_CONTEXT *const ec_ctx = xd->tile_ctx;
    if (delta_q_info->delta_lf_present_flag) {
      const int mi_row = xd->mi_row;
      const int mi_col = xd->mi_col;
      if (delta_q_info->delta_lf_multi) {
        const int frame_lf_count =
            av1_num_planes(cm) > 1 ? FRAME_LF_COUNT : FRAME_LF_COUNT - 2;
        for (int lf_id = 0; lf_id < frame_lf_count; ++lf_id) {
          const int tmp_lvl =
              xd->delta_lf[lf_id] +
              read_delta_lflevel(cm, r, ec_ctx->delta_lf_multi_cdf[lf_id], mbmi,
                                 mi_col, mi_row) *
                  delta_q_info->delta_lf_res;
          mbmi->delta_lf[lf_id] = xd->delta_lf[lf_id] =
              clamp(tmp_lvl, -MAX_LOOP_FILTER, MAX_LOOP_FILTER);
        }
      } else {
        const int tmp_lvl = xd->delta_lf_from_base +
                            read_delta_lflevel(cm, r, ec_ctx->delta_lf_cdf,
                                               mbmi, mi_col, mi_row) *
                                delta_q_info->delta_lf_res;
        mbmi->delta_lf_from_base = xd->delta_lf_from_base =
            clamp(tmp_lvl, -MAX_LOOP_FILTER, MAX_LOOP_FILTER);
      }
    }
  }
}